

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Elem_minimum_patch64
               (int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi,int g_c,
               int64_t *clo,int64_t *chi)

{
  int in_ECX;
  long in_RDX;
  Integer in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer c;
  Integer b;
  Integer a;
  int local_1f0;
  int local_1ec;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Integer in_stack_fffffffffffffe28;
  Integer *in_stack_fffffffffffffe30;
  Integer *in_stack_fffffffffffffe38;
  Integer in_stack_fffffffffffffe40;
  Integer in_stack_fffffffffffffe50;
  Integer *in_stack_fffffffffffffe58;
  Integer *in_stack_fffffffffffffe60;
  long local_198 [8];
  long local_158 [8];
  long local_118 [8];
  long local_d8 [8];
  long local_98 [7];
  Integer local_60;
  Integer local_58;
  Integer local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  
  local_38 = (long)in_EDI;
  local_40 = (long)in_ECX;
  local_48 = (long)in_stack_00000008;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_50 = pnga_ndim(in_RSI);
  local_58 = pnga_ndim(in_RSI);
  local_60 = pnga_ndim(in_RSI);
  for (iVar4 = 0; iVar4 < local_50; iVar4 = iVar4 + 1) {
    local_98[(local_50 - iVar4) + -1] = *(long *)(in_RSI + (long)iVar4 * 8) + 1;
  }
  for (iVar3 = 0; iVar3 < local_50; iVar3 = iVar3 + 1) {
    local_d8[(local_50 - iVar3) + -1] = *(long *)(local_18 + (long)iVar3 * 8) + 1;
  }
  for (iVar2 = 0; iVar2 < local_58; iVar2 = iVar2 + 1) {
    local_118[(local_58 - iVar2) + -1] = *(long *)(local_28 + (long)iVar2 * 8) + 1;
  }
  for (iVar1 = 0; iVar1 < local_58; iVar1 = iVar1 + 1) {
    local_158[(local_58 - iVar1) + -1] = *(long *)(local_30 + (long)iVar1 * 8) + 1;
  }
  for (local_1ec = 0; local_1ec < local_60; local_1ec = local_1ec + 1) {
    local_198[(local_60 - local_1ec) + -1] = *(long *)(in_stack_00000010 + (long)local_1ec * 8) + 1;
  }
  for (local_1f0 = 0; local_1f0 < local_60; local_1f0 = local_1f0 + 1) {
    *(long *)(&stack0xfffffffffffffe28 + ((local_60 - local_1f0) + -1) * 8) =
         *(long *)(_i_5 + (long)local_1f0 * 8) + 1;
  }
  pnga_elem_minimum_patch
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,(Integer *)CONCAT44(iVar4,iVar3),
             (Integer *)CONCAT44(iVar2,iVar1),in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe60);
  return;
}

Assistant:

void GA_Elem_minimum_patch64(int g_a, int64_t alo[], int64_t ahi[],
                             int g_b, int64_t blo[], int64_t bhi[],
                             int g_c, int64_t clo[], int64_t chi[])
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer c = (Integer)g_c;
    Integer andim = wnga_ndim(a);
    Integer bndim = wnga_ndim(b);
    Integer cndim = wnga_ndim(c);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    wnga_elem_minimum_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, c, _ga_clo, _ga_chi);
}